

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::CheckInitialized(Message *this)

{
  ulong uVar1;
  Descriptor *this_00;
  LogMessage *this_01;
  LogMessage *other;
  long *in_RDI;
  string *in_stack_ffffffffffffff38;
  LogMessage *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff50;
  string local_78 [55];
  byte local_41;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  uVar1 = (**(code **)(*in_RDI + 0x40))();
  local_41 = 0;
  if ((uVar1 & 1) == 0) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff50,level,(char *)in_stack_ffffffffffffff40,
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    local_41 = 1;
    internal::LogMessage::operator<<(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    this_00 = GetDescriptor((Message *)in_stack_ffffffffffffff40);
    Descriptor::full_name_abi_cxx11_(this_00);
    internal::LogMessage::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    this_01 = internal::LogMessage::operator<<
                        (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    (**(code **)(*in_RDI + 0x48))(local_78);
    other = internal::LogMessage::operator<<(this_01,in_stack_ffffffffffffff38);
    internal::LogFinisher::operator=((LogFinisher *)this_01,other);
    std::__cxx11::string::~string(local_78);
  }
  if ((local_41 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x4376d2);
  }
  return;
}

Assistant:

void Message::CheckInitialized() const {
  GOOGLE_CHECK(IsInitialized()) << "Message of type \"" << GetDescriptor()->full_name()
                         << "\" is missing required fields: "
                         << InitializationErrorString();
}